

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall CLI::ExtrasError::ExtrasError(ExtrasError *this,string *msg,ExitCodes exit_code)

{
  string local_78;
  allocator local_41;
  string local_40;
  ExitCodes local_1c;
  string *psStack_18;
  ExitCodes exit_code_local;
  string *msg_local;
  ExtrasError *this_local;
  
  local_1c = exit_code;
  psStack_18 = msg;
  msg_local = (string *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_40,"ExtrasError",&local_41);
  ::std::__cxx11::string::string((string *)&local_78,(string *)msg);
  ParseError::ParseError(&this->super_ParseError,&local_40,&local_78,local_1c);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  *(undefined ***)&(this->super_ParseError).super_Error = &PTR__ExtrasError_0018e1d0;
  return;
}

Assistant:

ExtrasError(std::vector<std::string> args)
        : ExtrasError((args.size() > 1 ? "The following arguments were not expected: "
                                       : "The following argument was not expected: ") +
                          detail::rjoin(args, " "),
                      ExitCodes::ExtrasError) {}